

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbutton.cpp
# Opt level: O1

bool __thiscall QToolButtonPrivate::hasMenu(QToolButtonPrivate *this)

{
  Data *pDVar1;
  long lVar2;
  
  if (this->defaultAction != (QAction *)0x0) {
    QAction::menuObject();
    lVar2 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    if (lVar2 != 0) {
      return true;
    }
  }
  pDVar1 = (this->menuAction).wp.d;
  if (((pDVar1 != (Data *)0x0) && (*(int *)(pDVar1 + 4) != 0)) &&
     ((this->menuAction).wp.value != (QObject *)0x0)) {
    QAction::menuObject();
    lVar2 = QMetaObject::cast((QObject *)&QMenu::staticMetaObject);
    if (lVar2 != 0) {
      return true;
    }
  }
  return (ulong)(this->defaultAction != (QAction *)0x0) <
         (ulong)(this->super_QAbstractButtonPrivate).super_QWidgetPrivate.actions.d.size;
}

Assistant:

bool QToolButtonPrivate::hasMenu() const
{
    return ((defaultAction && defaultAction->menu())
            || (menuAction && menuAction->menu())
            || actions.size() > (defaultAction ? 1 : 0));
}